

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArenaLite *metadata,int field_num)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  uint64 val;
  bool bVar4;
  int iVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  char *ptr_00;
  int iVar7;
  pair<const_char_*,_bool> pVar8;
  pair<const_char_*,_int> pVar9;
  uint64 varint;
  
  bVar1 = *ptr;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar9 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar6 = pVar9.second;
    ptr_00 = pVar9.first;
  }
  else {
    ptr_00 = ptr + 1;
  }
  if (ptr_00 != (char *)0x0) {
    pcVar3 = (ctx->super_EpsCopyInputStream).buffer_end_;
    uVar6 = uVar6 + ((int)ptr_00 - (int)pcVar3);
    (ctx->super_EpsCopyInputStream).limit_end_ = pcVar3 + (int)((int)uVar6 >> 0x1f & uVar6);
    iVar5 = (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar6;
    iVar5 = iVar5 - uVar6;
    if (-1 < iVar5) {
      while( true ) {
        if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
          pVar8._8_8_ = 0;
          pVar8.first = ptr_00;
        }
        else {
          pVar8._8_8_ = 1;
          pVar8.first = ptr_00;
          if ((long)ptr_00 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
              (long)(ctx->super_EpsCopyInputStream).limit_) {
            pVar8 = EpsCopyInputStream::DoneFallback(&ctx->super_EpsCopyInputStream,ptr_00,-1);
          }
        }
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
        ptr_00 = VarintParse<unsigned_long>(pVar8.first,&varint);
        val = varint;
        if (ptr_00 == (char *)0x0) {
          return (char *)0x0;
        }
        iVar7 = (int)varint;
        bVar4 = (*is_valid)(data,iVar7);
        if (bVar4) {
          if (*object == *(int *)((long)object + 4)) {
            RepeatedField<int>::Reserve((RepeatedField<int> *)object,*(int *)((long)object + 4) + 1)
            ;
          }
          iVar2 = *object;
          *(int *)object = iVar2 + 1;
          *(int *)(*(long *)((long)object + 8) + (long)iVar2 * 4) = iVar7;
        }
        else {
          if ((*(ulong *)metadata & 1) == 0) {
            s = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                ::mutable_unknown_fields_slow
                          ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                            *)metadata);
          }
          else {
            s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(ulong *)metadata & 0xfffffffffffffffe);
          }
          WriteVarint(field_num,val,s);
        }
      }
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
        uVar6 = iVar5 + (ctx->super_EpsCopyInputStream).limit_;
        (ctx->super_EpsCopyInputStream).limit_ = uVar6;
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6);
        return pVar8.first;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArenaLite* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}